

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsKeyReleased(int key_index)

{
  bool local_19;
  ImGuiContext *g;
  int key_index_local;
  
  if (key_index < 0) {
    g._7_1_ = false;
  }
  else {
    local_19 = 0x1ff < (uint)key_index;
    if (local_19) {
      __assert_fail("key_index >= 0 && key_index < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown)))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0xc44,"bool ImGui::IsKeyReleased(int)");
    }
    if (((GImGui->IO).KeysDownDurationPrev[key_index] < 0.0) ||
       (((GImGui->IO).KeysDown[key_index] & 1U) != 0)) {
      g._7_1_ = false;
    }
    else {
      g._7_1_ = true;
    }
  }
  return g._7_1_;
}

Assistant:

bool ImGui::IsKeyReleased(int key_index)
{
    ImGuiContext& g = *GImGui;
    if (key_index < 0) return false;
    IM_ASSERT(key_index >= 0 && key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    if (g.IO.KeysDownDurationPrev[key_index] >= 0.0f && !g.IO.KeysDown[key_index])
        return true;
    return false;
}